

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int tf_worker_hook(void *arg1,void *unused)

{
  scale_factors *psVar1;
  long lVar2;
  int mb_row;
  AV1_COMP *cpi;
  ThreadData_conflict *td;
  MB_MODE_INFO **ppMVar3;
  int iVar4;
  buf_2d *pbVar5;
  long lVar6;
  pthread_mutex_t *ppVar7;
  uint8_t *input_buffer [3];
  undefined8 auStack_48 [3];
  
  cpi = *arg1;
  td = *(ThreadData_conflict **)((long)arg1 + 8);
  ppVar7 = (cpi->mt_info).tf_sync.mutex_;
  (td->mb).e_mbd.error_info = (aom_internal_error_info *)((long)arg1 + 0x18);
  iVar4 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar4 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    lVar2 = (ulong)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1;
    pbVar5 = (td->mb).e_mbd.plane[0].pre;
    lVar6 = 0;
    do {
      auStack_48[lVar6] = pbVar5->buf;
      lVar6 = lVar6 + 1;
      pbVar5 = (buf_2d *)((long)(pbVar5 + 0x51) + 0x10);
    } while (lVar2 != lVar6);
    psVar1 = &(cpi->tf_ctx).sf;
    ppMVar3 = (td->mb).e_mbd.mi;
    (td->mb).e_mbd.block_ref_scale_factors[0] = psVar1;
    (td->mb).e_mbd.block_ref_scale_factors[1] = psVar1;
    (td->mb).e_mbd.mi = &(td->tf_data).tmp_mbmi;
    ((td->tf_data).tmp_mbmi)->motion_mode = '\0';
    iVar4 = (cpi->tf_ctx).mb_rows;
    ppVar7 = (cpi->mt_info).tf_sync.mutex_;
    pthread_mutex_lock((pthread_mutex_t *)ppVar7);
    if ((cpi->mt_info).tf_sync.tf_mt_exit == false) {
      do {
        mb_row = (cpi->mt_info).tf_sync.next_tf_row;
        if (iVar4 <= mb_row) break;
        (cpi->mt_info).tf_sync.next_tf_row = mb_row + 1;
        pthread_mutex_unlock((pthread_mutex_t *)ppVar7);
        av1_tf_do_filtering_row(cpi,td,mb_row);
        iVar4 = (cpi->tf_ctx).mb_rows;
        ppVar7 = (cpi->mt_info).tf_sync.mutex_;
        pthread_mutex_lock((pthread_mutex_t *)ppVar7);
      } while ((cpi->mt_info).tf_sync.tf_mt_exit != true);
    }
    pthread_mutex_unlock((pthread_mutex_t *)ppVar7);
    pbVar5 = (td->mb).e_mbd.plane[0].pre;
    lVar6 = 0;
    do {
      pbVar5->buf = (uint8_t *)auStack_48[lVar6];
      lVar6 = lVar6 + 1;
      pbVar5 = (buf_2d *)((long)(pbVar5 + 0x51) + 0x10);
    } while (lVar2 != lVar6);
    (td->mb).e_mbd.mi = ppMVar3;
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    iVar4 = 1;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)ppVar7);
    (cpi->mt_info).tf_sync.tf_mt_exit = true;
    pthread_mutex_unlock((pthread_mutex_t *)ppVar7);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int tf_worker_hook(void *arg1, void *unused) {
  (void)unused;
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1_COMP *cpi = thread_data->cpi;
  ThreadData *td = thread_data->td;
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  AV1TemporalFilterSync *tf_sync = &cpi->mt_info.tf_sync;
  const struct scale_factors *scale = &cpi->tf_ctx.sf;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *tf_mutex_ = tf_sync->mutex_;
#endif
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  xd->error_info = error_info;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(tf_mutex_);
    tf_sync->tf_mt_exit = true;
    pthread_mutex_unlock(tf_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  const int num_planes = av1_num_planes(&cpi->common);
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);

  MACROBLOCKD *mbd = &td->mb.e_mbd;
  uint8_t *input_buffer[MAX_MB_PLANE];
  MB_MODE_INFO **input_mb_mode_info;
  tf_save_state(mbd, &input_mb_mode_info, input_buffer, num_planes);
  tf_setup_macroblockd(mbd, &td->tf_data, scale);

  int current_mb_row = -1;

  while (tf_get_next_job(tf_sync, &current_mb_row, tf_ctx->mb_rows))
    av1_tf_do_filtering_row(cpi, td, current_mb_row);

  tf_restore_state(mbd, input_mb_mode_info, input_buffer, num_planes);

  error_info->setjmp = 0;
  return 1;
}